

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O3

void __thiscall Resolver::resolve(Resolver *this,String *host,uint16_t port,SharedPtr *socket)

{
  socklen_t __af;
  SharedPtr *pSVar1;
  bool bVar2;
  int iVar3;
  socklen_t *psVar4;
  sockaddr *psVar5;
  addrinfo *paVar6;
  size_t sVar7;
  SharedPtr *pSVar8;
  bool bVar9;
  in_addr inaddr4;
  in6_addr inaddr6;
  anon_struct_16_2_74ab348b addrs [2];
  undefined4 local_84;
  SharedPtr *local_80;
  sockaddr local_78;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  socklen_t local_58 [2];
  sockaddr *psStack_50;
  char *local_48;
  addrinfo *paStack_40;
  
  local_68._0_4_ = 2;
  uStack_60 = &local_84;
  local_58[0] = 10;
  psStack_50 = &local_78;
  psVar4 = (socklen_t *)local_68;
  bVar2 = true;
  local_80 = socket;
  do {
    bVar9 = bVar2;
    __af = *psVar4;
    iVar3 = inet_pton(__af,(host->mString)._M_dataplus._M_p,*(void **)(psVar4 + 2));
    if (iVar3 == 1) {
      if (__af == 10) {
        sVar7 = 0x1c;
        psVar5 = (sockaddr *)operator_new(0x1c);
        psVar5->sa_data[2] = '\0';
        psVar5->sa_data[3] = '\0';
        psVar5->sa_data[4] = '\0';
        psVar5->sa_data[5] = '\0';
        psVar5->sa_data[6] = '\0';
        psVar5->sa_data[7] = '\0';
        psVar5->sa_data[8] = '\0';
        psVar5->sa_data[9] = '\0';
        *(undefined8 *)(psVar5->sa_data + 10) = 0;
        psVar5[1].sa_data[2] = '\0';
        psVar5[1].sa_data[3] = '\0';
        psVar5[1].sa_data[4] = '\0';
        psVar5[1].sa_data[5] = '\0';
        psVar5[1].sa_data[6] = '\0';
        psVar5[1].sa_data[7] = '\0';
        psVar5[1].sa_data[8] = '\0';
        psVar5[1].sa_data[9] = '\0';
        *(ulong *)(psVar5->sa_data + 6) = CONCAT44(local_78.sa_data._2_4_,local_78._0_4_);
        *(undefined8 *)(psVar5 + 1) = local_78.sa_data._6_8_;
        psVar5->sa_family = 10;
      }
      else {
        if (__af != 2) {
          __assert_fail("addrs[i].af == AF_INET6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x8a,
                        "void Resolver::resolve(const String &, uint16_t, const SocketClient::SharedPtr &)"
                       );
        }
        sVar7 = 0x10;
        psVar5 = (sockaddr *)operator_new(0x10);
        psVar5->sa_data[6] = '\0';
        psVar5->sa_data[7] = '\0';
        psVar5->sa_data[8] = '\0';
        psVar5->sa_data[9] = '\0';
        psVar5->sa_data[10] = '\0';
        psVar5->sa_data[0xb] = '\0';
        psVar5->sa_data[0xc] = '\0';
        psVar5->sa_data[0xd] = '\0';
        *(undefined4 *)(psVar5->sa_data + 2) = local_84;
        psVar5->sa_family = 2;
      }
      *(uint16_t *)psVar5->sa_data = port << 8 | port >> 8;
      this->addr = psVar5;
      this->size = sVar7;
      return;
    }
    psVar4 = local_58;
    bVar2 = false;
  } while (bVar9);
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  local_48 = (char *)0x0;
  paStack_40 = (addrinfo *)0x0;
  local_58[0] = 0;
  local_58[1] = 0;
  psStack_50 = (sockaddr *)0x0;
  uStack_60._0_4_ = 1;
  uStack_60._4_4_ = 0;
  iVar3 = getaddrinfo((host->mString)._M_dataplus._M_p,(char *)0x0,(addrinfo *)local_68,
                      (addrinfo **)this);
  pSVar1 = local_80;
  if (iVar3 == 0) {
    for (paVar6 = this->res; paVar6 != (addrinfo *)0x0; paVar6 = paVar6->ai_next) {
      if (paVar6->ai_family == 2) {
        sVar7 = 0x10;
LAB_00161f0c:
        psVar5 = paVar6->ai_addr;
        this->addr = psVar5;
        *(uint16_t *)psVar5->sa_data = port << 8 | port >> 8;
        this->size = sVar7;
        break;
      }
      if (paVar6->ai_family == 10) {
        sVar7 = 0x1c;
        goto LAB_00161f0c;
      }
    }
    if (this->addr == (sockaddr *)0x0) {
      local_78.sa_family = 1;
      local_78.sa_data[0] = '\0';
      local_78.sa_data[1] = '\0';
      pSVar8 = local_80;
      Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
      operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                  *)&((local_80->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->mSignalError,local_80,(Error *)&local_78);
      SocketClient::close((pSVar1->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,(int)pSVar8);
      freeaddrinfo((addrinfo *)this->res);
      this->res = (addrinfo *)0x0;
    }
  }
  else {
    local_78.sa_family = 1;
    local_78.sa_data[0] = '\0';
    local_78.sa_data[1] = '\0';
    pSVar8 = local_80;
    Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::operator()
              ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                *)&((local_80->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                   ->mSignalError,local_80,(Error *)&local_78);
    SocketClient::close((pSVar1->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,(int)pSVar8);
  }
  return;
}

Assistant:

void Resolver::resolve(const String& host, uint16_t port, const SocketClient::SharedPtr& socket)
{
    // first, see if this parses as an IP mAddress
    {
        struct in_addr inaddr4;
        struct in6_addr inaddr6;
        struct { int af; void* dst; } addrs[2] = {
            { AF_INET, &inaddr4 },
            { AF_INET6, &inaddr6 }
        };
        for (int i = 0; i < 2; ++i) {
            if (inet_pton(addrs[i].af, host.constData(), addrs[i].dst) == 1) {
                // yes, use that
                if (addrs[i].af == AF_INET) {
                    sockaddr_in* newaddr = new sockaddr_in;
                    memset(newaddr, '\0', sizeof(sockaddr_in));
                    memcpy(&newaddr->sin_addr, &inaddr4, sizeof(struct in_addr));
                    newaddr->sin_family = AF_INET;
                    newaddr->sin_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in);
                } else {
                    assert(addrs[i].af == AF_INET6);
                    sockaddr_in6* newaddr = new sockaddr_in6;
                    memset(newaddr, '\0', sizeof(sockaddr_in6));
                    memcpy(&newaddr->sin6_addr, &inaddr6, sizeof(struct in6_addr));
                    newaddr->sin6_family = AF_INET6;
                    newaddr->sin6_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in6);
                }
                return;
            }
        }
    }

    // not an ip mAddress, try to resolve it
    addrinfo hints, *p;

    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC; // AF_INET or AF_INET6 to force version
    hints.ai_socktype = SOCK_STREAM;

    if (getaddrinfo(host.constData(), NULL, &hints, &res) != 0) {
        // bad
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        return;
    }

    for (p = res; p; p = p->ai_next) {
        if (p->ai_family == AF_INET) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in*>(addr)->sin_port = htons(port);
            size = sizeof(sockaddr_in);
            break;
        } else if (p->ai_family == AF_INET6) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in6*>(addr)->sin6_port = htons(port);
            size = sizeof(sockaddr_in6);
            break;
        }
    }

    if (!addr) {
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        freeaddrinfo(res);
        res = 0;
        return;
    }
}